

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

string * flatbuffers::swift::anon_unknown_1::GenArrayMainBody
                   (string *__return_storage_ptr__,string *optional)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"{{ACCESS_TYPE}} func {{FIELDMETHOD}}(at index: Int32) -> {{VALUETYPE}}",
                 optional);
  std::operator+(__return_storage_ptr__,&local_30," { ");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static std::string GenArrayMainBody(const std::string &optional) {
  return "{{ACCESS_TYPE}} func {{FIELDMETHOD}}(at index: Int32) -> "
         "{{VALUETYPE}}" +
         optional + " { ";
}